

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doGetUsedFuncs(Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                 *this,FuncSet *dst)

{
  Expr<tcu::Matrix<float,_3,_2>_> *pEVar1;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar2;
  
  (**(code **)(*(long *)this->m_func + 0x38))();
  pEVar1 = (this->m_args).a.super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
           super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_>
           .m_ptr;
  (*(pEVar1->super_ExprBase)._vptr_ExprBase[3])(pEVar1,dst);
  pEVar2 = (this->m_args).b.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  pEVar2 = (this->m_args).c.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  pEVar2 = (this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  return;
}

Assistant:

void				doGetUsedFuncs	(FuncSet& dst) const
	{
		m_func.getUsedFuncs(dst);
		m_args.a->getUsedFuncs(dst);
		m_args.b->getUsedFuncs(dst);
		m_args.c->getUsedFuncs(dst);
		m_args.d->getUsedFuncs(dst);
	}